

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSubsetHB.c
# Opt level: O2

double SubsetCountMintermAux(DdNode *node,double max,st__table *table)

{
  NodeData_t *value;
  double *pdVar1;
  NodeData_t *pNVar2;
  int iVar3;
  double **ppdVar4;
  NodeData_t **ppNVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  int *piVar11;
  double **ppdVar12;
  NodeData_t **ppNVar13;
  long lVar14;
  long lVar15;
  double dVar16;
  double dVar17;
  NodeData_t *dummy;
  
  piVar11 = (int *)((ulong)node & 0xfffffffffffffffe);
  if (*piVar11 == 0x7fffffff) {
    if (zero != node) {
      return max;
    }
    return 0.0;
  }
  iVar3 = st__lookup(table,(char *)node,(char **)&dummy);
  if (iVar3 != 0) {
    return *dummy->mintermPointer;
  }
  uVar10 = *(ulong *)(piVar11 + 6);
  uVar8 = (ulong)((uint)node & 1);
  dVar16 = SubsetCountMintermAux((DdNode *)(*(ulong *)(piVar11 + 4) ^ uVar8),max,table);
  if (memOut != '\0') {
    return 0.0;
  }
  dVar17 = SubsetCountMintermAux((DdNode *)(uVar8 ^ uVar10),max,table);
  iVar3 = page;
  if (memOut != '\0') {
    return 0.0;
  }
  iVar6 = pageIndex;
  if (pageIndex == 0x800) {
    lVar14 = (long)page;
    uVar9 = page + 1;
    page = uVar9;
    if (uVar9 == maxPages) {
      ppdVar4 = (double **)malloc(lVar14 * 8 + 0x408);
      ppdVar12 = mintermPages;
      if (ppdVar4 != (double **)0x0) {
        maxPages = iVar3 + 0x81;
        uVar8 = 0;
        uVar10 = (ulong)uVar9;
        if ((int)uVar9 < 1) {
          uVar10 = uVar8;
        }
        for (; uVar10 != uVar8; uVar8 = uVar8 + 1) {
          ppdVar4[uVar8] = ppdVar12[uVar8];
        }
        free(ppdVar12);
        mintermPages = ppdVar4;
        goto LAB_00666aef;
      }
      iVar6 = -1;
      if (-1 < iVar3) {
        iVar6 = iVar3;
      }
      for (lVar14 = 0; (long)iVar6 + 1 != lVar14; lVar14 = lVar14 + 1) {
        if (ppdVar12[lVar14] != (double *)0x0) {
          free(ppdVar12[lVar14]);
          ppdVar12[lVar14] = (double *)0x0;
        }
      }
      if (ppdVar12 != (double **)0x0) goto LAB_00666d78;
    }
    else {
LAB_00666aef:
      ppdVar12 = mintermPages;
      currentMintermPage = (double *)malloc(0x4000);
      ppdVar12[lVar14 + 1] = currentMintermPage;
      iVar6 = 0;
      if (currentMintermPage != (double *)0x0) goto LAB_00666b16;
      iVar6 = -1;
      if (-1 < iVar3) {
        iVar6 = iVar3;
      }
      for (lVar14 = 0; (long)iVar6 + 1 != lVar14; lVar14 = lVar14 + 1) {
        if (ppdVar12[lVar14] != (double *)0x0) {
          free(ppdVar12[lVar14]);
          ppdVar12[lVar14] = (double *)0x0;
        }
      }
LAB_00666d78:
      free(ppdVar12);
      mintermPages = (double **)0x0;
    }
    ppNVar13 = nodeDataPages;
    memOut = 1;
    lVar15 = (long)nodeDataPage;
    for (lVar14 = 0; lVar14 <= lVar15; lVar14 = lVar14 + 1) {
      if (ppNVar13[lVar14] != (NodeData_t *)0x0) {
        free(ppNVar13[lVar14]);
        ppNVar13[lVar14] = (NodeData_t *)0x0;
      }
    }
  }
  else {
LAB_00666b16:
    pdVar1 = currentMintermPage;
    dVar16 = dVar17 * 0.5 + dVar16 * 0.5;
    pageIndex = iVar6 + 1;
    currentMintermPage[iVar6] = dVar16;
    iVar3 = nodeDataPage;
    iVar7 = nodeDataPageIndex;
    if (nodeDataPageIndex == 0x400) {
      lVar14 = (long)nodeDataPage;
      uVar9 = nodeDataPage + 1;
      nodeDataPage = uVar9;
      if (uVar9 == maxNodeDataPages) {
        ppNVar5 = (NodeData_t **)malloc(lVar14 * 8 + 0x408);
        ppNVar13 = nodeDataPages;
        if (ppNVar5 != (NodeData_t **)0x0) {
          maxNodeDataPages = iVar3 + 0x81;
          uVar8 = 0;
          uVar10 = (ulong)uVar9;
          if ((int)uVar9 < 1) {
            uVar10 = uVar8;
          }
          for (; uVar10 != uVar8; uVar8 = uVar8 + 1) {
            ppNVar5[uVar8] = ppNVar13[uVar8];
          }
          free(ppNVar13);
          nodeDataPages = ppNVar5;
          goto LAB_00666c27;
        }
        iVar6 = -1;
        if (-1 < iVar3) {
          iVar6 = iVar3;
        }
        for (lVar14 = 0; (long)iVar6 + 1 != lVar14; lVar14 = lVar14 + 1) {
          if (ppNVar13[lVar14] != (NodeData_t *)0x0) {
            free(ppNVar13[lVar14]);
            ppNVar13[lVar14] = (NodeData_t *)0x0;
          }
        }
        if (ppNVar13 != (NodeData_t **)0x0) goto LAB_00666e13;
      }
      else {
LAB_00666c27:
        ppNVar13 = nodeDataPages;
        currentNodeDataPage = (NodeData_t *)malloc(0x6000);
        ppNVar13[lVar14 + 1] = currentNodeDataPage;
        iVar7 = 0;
        if (currentNodeDataPage != (NodeData_t *)0x0) goto LAB_00666c4d;
        iVar6 = -1;
        if (-1 < iVar3) {
          iVar6 = iVar3;
        }
        for (lVar14 = 0; (long)iVar6 + 1 != lVar14; lVar14 = lVar14 + 1) {
          if (ppNVar13[lVar14] != (NodeData_t *)0x0) {
            free(ppNVar13[lVar14]);
            ppNVar13[lVar14] = (NodeData_t *)0x0;
          }
        }
LAB_00666e13:
        free(ppNVar13);
        nodeDataPages = (NodeData_t **)0x0;
      }
      ppdVar12 = mintermPages;
      memOut = 1;
      lVar15 = (long)page;
      for (lVar14 = 0; lVar14 <= lVar15; lVar14 = lVar14 + 1) {
        if (ppdVar12[lVar14] != (double *)0x0) {
          free(ppdVar12[lVar14]);
          ppdVar12[lVar14] = (double *)0x0;
        }
      }
      if (ppdVar12 != (double **)0x0) {
        free(ppdVar12);
        mintermPages = (double **)0x0;
      }
      goto LAB_00666e6d;
    }
LAB_00666c4d:
    pNVar2 = currentNodeDataPage;
    value = currentNodeDataPage + iVar7;
    nodeDataPageIndex = iVar7 + 1;
    currentNodeDataPage[iVar7].mintermPointer = pdVar1 + iVar6;
    pNVar2[iVar7].nodesPointer = (int *)0x0;
    iVar3 = st__insert(table,(char *)node,(char *)value);
    ppdVar12 = mintermPages;
    if (iVar3 != -10000) {
      return dVar16;
    }
    memOut = 1;
    lVar15 = (long)page;
    for (lVar14 = 0; lVar14 <= lVar15; lVar14 = lVar14 + 1) {
      if (ppdVar12[lVar14] != (double *)0x0) {
        free(ppdVar12[lVar14]);
        ppdVar12[lVar14] = (double *)0x0;
      }
    }
    if (ppdVar12 != (double **)0x0) {
      free(ppdVar12);
      mintermPages = (double **)0x0;
    }
    ppNVar13 = nodeDataPages;
    lVar15 = (long)nodeDataPage;
    for (lVar14 = 0; lVar14 <= lVar15; lVar14 = lVar14 + 1) {
      if (ppNVar13[lVar14] != (NodeData_t *)0x0) {
        free(ppNVar13[lVar14]);
        ppNVar13[lVar14] = (NodeData_t *)0x0;
      }
    }
  }
  if (ppNVar13 != (NodeData_t **)0x0) {
    free(ppNVar13);
    nodeDataPages = (NodeData_t **)0x0;
  }
LAB_00666e6d:
  st__free_table(table);
  return 0.0;
}

Assistant:

static double
SubsetCountMintermAux(
  DdNode * node /* function to analyze */,
  double  max /* number of minterms of constant 1 */,
  st__table * table /* visitedTable table */)
{

    DdNode      *N,*Nv,*Nnv; /* nodes to store cofactors  */
    double      min,*pmin; /* minterm count */
    double      min1, min2; /* minterm count */
    NodeData_t *dummy;
    NodeData_t *newEntry;
    int i;

#ifdef DEBUG
    num_calls++;
#endif

    /* Constant case */
    if (Cudd_IsConstant(node)) {
        if (node == zero) {
            return(0.0);
        } else {
            return(max);
        }
    } else {

        /* check if entry for this node exists */
        if ( st__lookup(table, (const char *)node, (char **)&dummy)) {
            min = *(dummy->mintermPointer);
            return(min);
        }

        /* Make the node regular to extract cofactors */
        N = Cudd_Regular(node);

        /* store the cofactors */
        Nv = Cudd_T(N);
        Nnv = Cudd_E(N);

        Nv = Cudd_NotCond(Nv, Cudd_IsComplement(node));
        Nnv = Cudd_NotCond(Nnv, Cudd_IsComplement(node));

        min1 =  SubsetCountMintermAux(Nv, max,table)/2.0;
        if (memOut) return(0.0);
        min2 =  SubsetCountMintermAux(Nnv,max,table)/2.0;
        if (memOut) return(0.0);
        min = (min1+min2);

        /* if page index is at the bottom, then create a new page */
        if (pageIndex == pageSize) ResizeCountMintermPages();
        if (memOut) {
            for (i = 0; i <= nodeDataPage; i++) ABC_FREE(nodeDataPages[i]);
            ABC_FREE(nodeDataPages);
            st__free_table(table);
            return(0.0);
        }

        /* point to the correct location in the page */
        pmin = currentMintermPage+pageIndex;
        pageIndex++;

        /* store the minterm count of this node in the page */
        *pmin = min;

        /* Note I allocate the struct here. Freeing taken care of later */
        if (nodeDataPageIndex == nodeDataPageSize) ResizeNodeDataPages();
        if (memOut) {
            for (i = 0; i <= page; i++) ABC_FREE(mintermPages[i]);
            ABC_FREE(mintermPages);
            st__free_table(table);
            return(0.0);
        }

        newEntry = currentNodeDataPage + nodeDataPageIndex;
        nodeDataPageIndex++;

        /* points to the correct location in the page */
        newEntry->mintermPointer = pmin;
        /* initialize this field of the Node Quality structure */
        newEntry->nodesPointer = NULL;

        /* insert entry for the node in the table */
        if ( st__insert(table,(char *)node, (char *)newEntry) == st__OUT_OF_MEM) {
            memOut = 1;
            for (i = 0; i <= page; i++) ABC_FREE(mintermPages[i]);
            ABC_FREE(mintermPages);
            for (i = 0; i <= nodeDataPage; i++) ABC_FREE(nodeDataPages[i]);
            ABC_FREE(nodeDataPages);
            st__free_table(table);
            return(0.0);
        }
        return(min);
    }

}